

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.cpp
# Opt level: O0

void test_qclab_qgates_SWAP<float>(void)

{
  allocator<float> *paVar1;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<float> __l_05;
  initializer_list<float> __l_06;
  initializer_list<float> __l_07;
  initializer_list<float> __l_08;
  bool bVar2;
  char *pcVar3;
  reference pvVar4;
  float *pfVar5;
  char *in_R9;
  string local_10b0;
  AssertHelper local_1090;
  Message local_1088;
  bool local_1079;
  undefined1 local_1078 [8];
  AssertionResult gtest_ar__21;
  SquareMatrix<float> mat3_1;
  SquareMatrix<float> check;
  SWAP<float> swap_6;
  AssertHelper local_1018;
  Message local_1010;
  SquareMatrix<float> local_1008;
  SquareMatrix<float> local_ff8;
  bool local_fe1;
  undefined1 local_fe0 [8];
  AssertionResult gtest_ar__20;
  int qnew_2 [2];
  AssertHelper local_fa8;
  Message local_fa0;
  SquareMatrix<float> local_f98;
  SquareMatrix<float> local_f88;
  bool local_f71;
  undefined1 local_f70 [8];
  AssertionResult gtest_ar__19;
  SquareMatrix<float> mat3;
  AssertHelper local_f30;
  Message local_f28;
  SquareMatrix<float> local_f20;
  SquareMatrix<float> local_f10;
  bool local_ef9;
  undefined1 local_ef8 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_ec8;
  Message local_ec0;
  SquareMatrix<float> local_eb8;
  SquareMatrix<float> local_ea8;
  SquareMatrix<float> local_e98;
  bool local_e81;
  undefined1 local_e80 [8];
  AssertionResult gtest_ar__17;
  SquareMatrix<float> mat;
  AssertHelper local_e40;
  Message local_e38;
  SquareMatrix<float> local_e30;
  bool local_e19;
  undefined1 local_e18 [8];
  AssertionResult gtest_ar__16;
  SquareMatrix<float> mat2;
  SWAP<float> swap_5;
  AssertHelper local_dc8;
  Message local_dc0;
  bool local_db1;
  undefined1 local_db0 [8];
  AssertionResult gtest_ar__15;
  float local_d98 [10];
  iterator local_d70;
  size_type local_d68;
  undefined1 local_d60 [8];
  V check3_1;
  V vec3_1;
  SWAP<float> swap_4;
  AssertHelper local_d00;
  Message local_cf8;
  bool local_ce9;
  undefined1 local_ce8 [8];
  AssertionResult gtest_ar__14;
  string local_c80;
  AssertHelper local_c60;
  Message local_c58;
  bool local_c49;
  undefined1 local_c48 [8];
  AssertionResult gtest_ar__13;
  string local_be8;
  AssertHelper local_bc8;
  Message local_bc0;
  bool local_bb1;
  undefined1 local_bb0 [8];
  AssertionResult gtest_ar__12;
  float local_b98 [18];
  iterator local_b50;
  size_type local_b48;
  undefined1 local_b40 [8];
  V check4;
  V vec4;
  AssertHelper local_af0;
  Message local_ae8;
  bool local_ad9;
  undefined1 local_ad8 [8];
  AssertionResult gtest_ar__11;
  int local_a90 [2];
  int qnew_1 [2];
  AssertHelper local_a68;
  Message local_a60;
  bool local_a51;
  undefined1 local_a50 [8];
  AssertionResult gtest_ar__10;
  float local_a38 [10];
  iterator local_a10;
  size_type local_a08;
  undefined1 local_a00 [8];
  V check3;
  V vec3;
  AssertHelper local_9b0;
  Message local_9a8;
  bool local_999;
  undefined1 local_998 [8];
  AssertionResult gtest_ar__9;
  float local_980 [4];
  iterator local_970;
  size_type local_968;
  undefined1 local_960 [8];
  V check2;
  V vec2;
  SWAP<float> swap_3;
  Message local_918;
  int local_90c;
  vector<int,_std::allocator<int>_> local_908;
  undefined1 local_8f0 [8];
  AssertionResult gtest_ar_14;
  Message local_8d8;
  int local_8cc;
  vector<int,_std::allocator<int>_> local_8c8;
  undefined1 local_8b0 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_880;
  Message local_878;
  bool local_869;
  undefined1 local_868 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_838;
  Message local_830;
  bool local_821;
  undefined1 local_820 [8];
  AssertionResult gtest_ar__7;
  Message local_808;
  int local_800;
  int local_7fc;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar_12;
  SWAP<float> swap_2;
  int qubits_1 [2];
  Message local_7c8;
  int local_7bc;
  vector<int,_std::allocator<int>_> local_7b8;
  undefined1 local_7a0 [8];
  AssertionResult gtest_ar_11;
  Message local_788;
  int local_77c;
  vector<int,_std::allocator<int>_> local_778;
  undefined1 local_760 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_730;
  Message local_728;
  bool local_719;
  undefined1 local_718 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_6e8;
  Message local_6e0;
  bool local_6d1;
  undefined1 local_6d0 [8];
  AssertionResult gtest_ar__5;
  Message local_6b8;
  int local_6b0;
  int local_6ac;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar_9;
  SWAP<float> swap_1;
  AssertHelper local_668;
  Message local_660;
  bool local_651;
  undefined1 local_650 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_620;
  Message local_618;
  bool local_609;
  undefined1 local_608 [8];
  AssertionResult gtest_ar__3;
  SWAP<float> swap2;
  AssertHelper local_5c8;
  Message local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  undefined1 local_598 [8];
  AssertionResult gtest_ar_8;
  Message local_580;
  int local_578;
  int local_574;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_7;
  stringstream qasm;
  ostream local_550 [376];
  string local_3d8;
  AssertHelper local_3b8;
  Message local_3b0;
  SquareMatrix<float> local_3a8;
  bool local_391;
  undefined1 local_390 [8];
  AssertionResult gtest_ar__2;
  SquareMatrix<float> SWAP_check;
  Message local_368;
  int local_35c;
  vector<int,_std::allocator<int>_> local_358;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_6;
  Message local_328;
  int local_31c;
  vector<int,_std::allocator<int>_> local_318;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_5;
  int qnew [2];
  Message local_2e0;
  int local_2d4;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_4;
  Message local_2b8;
  int local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_3;
  Message local_290;
  int local_284;
  size_type local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_2;
  vector<int,_std::allocator<int>_> qubits;
  Message local_248;
  int local_240;
  int local_23c;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_208;
  Message local_200;
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_1c0;
  Message local_1b8;
  bool local_1a9;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_;
  Message local_190;
  int local_188;
  int local_184;
  undefined1 local_180 [8];
  AssertionResult gtest_ar;
  SWAP<float> swap;
  float local_158 [16];
  iterator local_118;
  size_type local_110;
  undefined1 local_108 [8];
  V v4;
  float local_e8 [10];
  iterator local_c0;
  size_type local_b8;
  undefined1 local_b0 [8];
  V v3;
  float local_90 [4];
  iterator local_80;
  size_type local_78;
  undefined1 local_70 [8];
  V v2;
  SquareMatrix<float> I4;
  SquareMatrix<float> I3;
  undefined1 local_28 [8];
  SquareMatrix<float> I2;
  SquareMatrix<float> I1;
  
  qclab::dense::eye<float>((dense *)&I2.data_,2);
  qclab::dense::eye<float>((dense *)local_28,4);
  qclab::dense::eye<float>((dense *)&I4.data_,8);
  qclab::dense::eye<float>
            ((dense *)&v2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,0x10);
  local_90[0] = 3.0;
  local_90[1] = 5.0;
  local_90[2] = 2.0;
  local_90[3] = 7.0;
  local_80 = local_90;
  local_78 = 4;
  paVar1 = (allocator<float> *)
           ((long)&v3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(paVar1);
  __l_08._M_len = local_78;
  __l_08._M_array = local_80;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_70,__l_08,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&v3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_e8[4] = 4.0;
  local_e8[5] = 1.0;
  local_e8[6] = 8.0;
  local_e8[7] = 3.0;
  local_e8[0] = 3.0;
  local_e8[1] = 5.0;
  local_e8[2] = 2.0;
  local_e8[3] = 7.0;
  local_c0 = local_e8;
  local_b8 = 8;
  paVar1 = (allocator<float> *)
           ((long)&v4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(paVar1);
  __l_07._M_len = local_b8;
  __l_07._M_array = local_c0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_b0,__l_07,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&v4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_158[0xc] = 8.0;
  local_158[0xd] = 9.0;
  local_158[0xe] = 5.0;
  local_158[0xf] = 1.0;
  local_158[8] = 7.0;
  local_158[9] = 2.0;
  local_158[10] = 5.0;
  local_158[0xb] = 6.0;
  local_158[4] = 4.0;
  local_158[5] = 1.0;
  local_158[6] = 8.0;
  local_158[7] = 3.0;
  local_158[0] = 3.0;
  local_158[1] = 5.0;
  local_158[2] = 2.0;
  local_158[3] = 7.0;
  local_118 = local_158;
  local_110 = 0x10;
  paVar1 = (allocator<float> *)((long)swap.qubits_._M_elems + 7);
  std::allocator<float>::allocator(paVar1);
  __l_06._M_len = local_110;
  __l_06._M_array = local_118;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_108,__l_06,paVar1);
  std::allocator<float>::~allocator((allocator<float> *)((long)swap.qubits_._M_elems + 7));
  qclab::qgates::SWAP<float>::SWAP((SWAP<float> *)&gtest_ar.message_);
  local_184 = qclab::qgates::QGate2<float>::nbQubits((QGate2<float> *)&gtest_ar.message_);
  local_188 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_180,"swap.nbQubits()","2",&local_184,&local_188);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar2) {
    testing::Message::Message(&local_190);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x15,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1a9 = qclab::qgates::SWAP<float>::fixed((SWAP<float> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a8,&local_1a9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar2) {
    testing::Message::Message(&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_1a8,(AssertionResult *)0x693043,
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x16,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  bVar2 = qclab::qgates::SWAP<float>::controlled((SWAP<float> *)&gtest_ar.message_);
  local_1f1 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f0,&local_1f1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar2) {
    testing::Message::Message(&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_1f0,(AssertionResult *)0x693051,
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x17,pcVar3);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_23c = qclab::qgates::SWAP<float>::qubit((SWAP<float> *)&gtest_ar.message_);
  local_240 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_238,"swap.qubit()","0",&local_23c,&local_240);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar2) {
    testing::Message::Message(&local_248);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1a,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,&local_248);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  qclab::qgates::SWAP<float>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,
             (SWAP<float> *)&gtest_ar.message_);
  local_280 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_);
  local_284 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_278,"qubits.size()","2",&local_280,&local_284);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar2) {
    testing::Message::Message(&local_290);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,0);
  local_2ac = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2a8,"qubits[0]","0",pvVar4,&local_2ac);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar2) {
    testing::Message::Message(&local_2b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,1);
  local_2d4 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2d0,"qubits[1]","1",pvVar4,&local_2d4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar2) {
    testing::Message::Message(&local_2e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qnew,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)qnew,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qnew);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x500000003;
  qclab::qgates::SWAP<float>::setQubits
            ((SWAP<float> *)&gtest_ar.message_,(int *)&gtest_ar_5.message_);
  qclab::qgates::SWAP<float>::qubits(&local_318,(SWAP<float> *)&gtest_ar.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_318,0);
  local_31c = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_300,"swap.qubits()[0]","3",pvVar4,&local_31c);
  std::vector<int,_std::allocator<int>_>::~vector(&local_318);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar2) {
    testing::Message::Message(&local_328);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  qclab::qgates::SWAP<float>::qubits(&local_358,(SWAP<float> *)&gtest_ar.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_358,1);
  local_35c = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_340,"swap.qubits()[1]","5",pvVar4,&local_35c);
  std::vector<int,_std::allocator<int>_>::~vector(&local_358);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar2) {
    testing::Message::Message(&local_368);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&SWAP_check.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x24,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&SWAP_check.data_,&local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&SWAP_check.data_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x100000000;
  qclab::qgates::SWAP<float>::setQubits
            ((SWAP<float> *)&gtest_ar.message_,(int *)&gtest_ar_5.message_);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__2.message_,1.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,1.0,
             0.0,0.0,0.0,0.0,0.0,1.0);
  qclab::qgates::SWAP<float>::matrix((SWAP<float> *)&local_3a8);
  local_391 = qclab::dense::SquareMatrix<float>::operator==
                        (&local_3a8,(SquareMatrix<float> *)&gtest_ar__2.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_390,&local_391,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_3a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar2) {
    testing::Message::Message(&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3d8,(internal *)local_390,(AssertionResult *)"swap.matrix() == SWAP_check",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x2e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b8);
    std::__cxx11::string::~string((string *)&local_3d8);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  qclab::qgates::QGate2<float>::print((QGate2<float> *)&gtest_ar.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_7.message_);
  local_574 = qclab::qgates::SWAP<float>::toQASM((SWAP<float> *)&gtest_ar.message_,local_550,0);
  local_578 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_570,"swap.toQASM( qasm )","0",&local_574,&local_578);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
  if (!bVar2) {
    testing::Message::Message(&local_580);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x35,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_580);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[18],_nullptr>
            ((EqHelper *)local_598,"qasm.str()","\"swap q[0], q[1];\\n\"",&local_5b8,
             (char (*) [18])0x6930df);
  std::__cxx11::string::~string((string *)&local_5b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_598);
  if (!bVar2) {
    testing::Message::Message(&local_5c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_598);
    testing::internal::AssertHelper::AssertHelper
              (&local_5c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x36,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5c8,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5c8);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_598);
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)&std::cout,(string *)&swap2.qubits_);
  std::__cxx11::string::~string((string *)&swap2.qubits_);
  qclab::qgates::SWAP<float>::SWAP((SWAP<float> *)&gtest_ar__3.message_,2,4);
  local_609 = qclab::QObject<float>::operator==
                        ((QObject<float> *)&gtest_ar.message_,
                         (QObject<float> *)&gtest_ar__3.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_608,&local_609,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
  if (!bVar2) {
    testing::Message::Message(&local_618);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_608,
               (AssertionResult *)"swap == swap2","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_620,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_620,&local_618);
    testing::internal::AssertHelper::~AssertHelper(&local_620);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_618);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_608);
  bVar2 = qclab::QObject<float>::operator!=
                    ((QObject<float> *)&gtest_ar.message_,(QObject<float> *)&gtest_ar__3.message_);
  local_651 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_650,&local_651,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_650);
  if (!bVar2) {
    testing::Message::Message(&local_660);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&swap_1.qubits_,(internal *)local_650,(AssertionResult *)"swap != swap2",
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_668,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_668,&local_660);
    testing::internal::AssertHelper::~AssertHelper(&local_668);
    std::__cxx11::string::~string((string *)&swap_1.qubits_);
    testing::Message::~Message(&local_660);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_650);
  qclab::qgates::SWAP<float>::~SWAP((SWAP<float> *)&gtest_ar__3.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_7.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__2.message_);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_);
  qclab::qgates::SWAP<float>::~SWAP((SWAP<float> *)&gtest_ar.message_);
  qclab::qgates::SWAP<float>::SWAP((SWAP<float> *)&gtest_ar_9.message_,3,5);
  local_6ac = qclab::qgates::QGate2<float>::nbQubits((QGate2<float> *)&gtest_ar_9.message_);
  local_6b0 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_6a8,"swap.nbQubits()","2",&local_6ac,&local_6b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar2) {
    testing::Message::Message(&local_6b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x42,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_6b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  local_6d1 = qclab::qgates::SWAP<float>::fixed((SWAP<float> *)&gtest_ar_9.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6d0,&local_6d1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d0);
  if (!bVar2) {
    testing::Message::Message(&local_6e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_6d0,(AssertionResult *)0x693043,
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x43,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6e8,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper(&local_6e8);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d0);
  bVar2 = qclab::qgates::SWAP<float>::controlled((SWAP<float> *)&gtest_ar_9.message_);
  local_719 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_718,&local_719,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar2) {
    testing::Message::Message(&local_728);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_10.message_,(internal *)local_718,(AssertionResult *)0x693051,
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_730,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x44,pcVar3);
    testing::internal::AssertHelper::operator=(&local_730,&local_728);
    testing::internal::AssertHelper::~AssertHelper(&local_730);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  qclab::qgates::SWAP<float>::qubits(&local_778,(SWAP<float> *)&gtest_ar_9.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_778,0);
  local_77c = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_760,"swap.qubits()[0]","3",pvVar4,&local_77c);
  std::vector<int,_std::allocator<int>_>::~vector(&local_778);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_760);
  if (!bVar2) {
    testing::Message::Message(&local_788);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_760);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_788);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_760);
  qclab::qgates::SWAP<float>::qubits(&local_7b8,(SWAP<float> *)&gtest_ar_9.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_7b8,1);
  local_7bc = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_7a0,"swap.qubits()[1]","5",pvVar4,&local_7bc);
  std::vector<int,_std::allocator<int>_>::~vector(&local_7b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a0);
  if (!bVar2) {
    testing::Message::Message(&local_7c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qubits_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x46,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)qubits_1,&local_7c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qubits_1);
    testing::Message::~Message(&local_7c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a0);
  qclab::qgates::SWAP<float>::~SWAP((SWAP<float> *)&gtest_ar_9.message_);
  swap_2.qubits_._M_elems[0] = 3;
  swap_2.qubits_._M_elems[1] = 5;
  qclab::qgates::SWAP<float>::SWAP((SWAP<float> *)&gtest_ar_12.message_,swap_2.qubits_._M_elems);
  local_7fc = qclab::qgates::QGate2<float>::nbQubits((QGate2<float> *)&gtest_ar_12.message_);
  local_800 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_7f8,"swap.nbQubits()","2",&local_7fc,&local_800);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
  if (!bVar2) {
    testing::Message::Message(&local_808);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x4d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7.message_,&local_808);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_808);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
  local_821 = qclab::qgates::SWAP<float>::fixed((SWAP<float> *)&gtest_ar_12.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_820,&local_821,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_820);
  if (!bVar2) {
    testing::Message::Message(&local_830);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_820,(AssertionResult *)0x693043,
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_838,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x4e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_838,&local_830);
    testing::internal::AssertHelper::~AssertHelper(&local_838);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_830);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_820);
  bVar2 = qclab::qgates::SWAP<float>::controlled((SWAP<float> *)&gtest_ar_12.message_);
  local_869 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_868,&local_869,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
  if (!bVar2) {
    testing::Message::Message(&local_878);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_13.message_,(internal *)local_868,(AssertionResult *)0x693051,
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_880,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x4f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_880,&local_878);
    testing::internal::AssertHelper::~AssertHelper(&local_880);
    std::__cxx11::string::~string((string *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
  qclab::qgates::SWAP<float>::qubits(&local_8c8,(SWAP<float> *)&gtest_ar_12.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_8c8,0);
  local_8cc = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_8b0,"swap.qubits()[0]","3",pvVar4,&local_8cc);
  std::vector<int,_std::allocator<int>_>::~vector(&local_8c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b0);
  if (!bVar2) {
    testing::Message::Message(&local_8d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_8b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x50,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_8d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_8d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b0);
  qclab::qgates::SWAP<float>::qubits(&local_908,(SWAP<float> *)&gtest_ar_12.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_908,1);
  local_90c = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_8f0,"swap.qubits()[1]","5",pvVar4,&local_90c);
  std::vector<int,_std::allocator<int>_>::~vector(&local_908);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f0);
  if (!bVar2) {
    testing::Message::Message(&local_918);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_8f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&swap_3.qubits_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x51,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&swap_3.qubits_,&local_918);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&swap_3.qubits_);
    testing::Message::~Message(&local_918);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f0);
  qclab::qgates::SWAP<float>::~SWAP((SWAP<float> *)&gtest_ar_12.message_);
  qclab::qgates::SWAP<float>::SWAP
            ((SWAP<float> *)
             &vec2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,0,1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_70);
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)
             &vec2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,NoTrans,2,
             (vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_980[0] = 3.0;
  local_980[1] = 2.0;
  local_980[2] = 5.0;
  local_980[3] = 7.0;
  local_970 = local_980;
  local_968 = 4;
  paVar1 = (allocator<float> *)
           ((long)&gtest_ar__9.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<float>::allocator(paVar1);
  __l_05._M_len = local_968;
  __l_05._M_array = local_970;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_960,__l_05,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&gtest_ar__9.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_999 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_960);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_998,&local_999,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_998);
  if (!bVar2) {
    testing::Message::Message(&local_9a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_998,
               (AssertionResult *)"vec2 == check2","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x5b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_9b0,&local_9a8);
    testing::internal::AssertHelper::~AssertHelper(&local_9b0);
    std::__cxx11::string::~string
              ((string *)
               &vec3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_9a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_998);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &check3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_b0);
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)
             &vec2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,NoTrans,3,
             (vector<float,_std::allocator<float>_> *)
             &check3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_a38[4] = 2.0;
  local_a38[5] = 7.0;
  local_a38[6] = 8.0;
  local_a38[7] = 3.0;
  local_a38[0] = 3.0;
  local_a38[1] = 5.0;
  local_a38[2] = 4.0;
  local_a38[3] = 1.0;
  local_a10 = local_a38;
  local_a08 = 8;
  paVar1 = (allocator<float> *)
           ((long)&gtest_ar__10.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<float>::allocator(paVar1);
  __l_04._M_len = local_a08;
  __l_04._M_array = local_a10;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a00,__l_04,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&gtest_ar__10.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_a51 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_a00);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a50,&local_a51,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a50);
  if (!bVar2) {
    testing::Message::Message(&local_a60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)qnew_1,(internal *)local_a50,(AssertionResult *)"vec3 == check3","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x67,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a68,&local_a60);
    testing::internal::AssertHelper::~AssertHelper(&local_a68);
    std::__cxx11::string::~string((string *)qnew_1);
    testing::Message::~Message(&local_a60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a50);
  local_a90[0] = 1;
  local_a90[1] = 2;
  qclab::qgates::SWAP<float>::setQubits
            ((SWAP<float> *)
             &vec2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,local_a90);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &check3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_b0);
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)
             &vec2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,NoTrans,3,
             (vector<float,_std::allocator<float>_> *)
             &check3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__11.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4000000040400000;
  __l_03._M_len = 8;
  __l_03._M_array = (iterator)&gtest_ar__11.message_;
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)local_a00,__l_03);
  local_ad9 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_a00);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ad8,&local_ad9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad8);
  if (!bVar2) {
    testing::Message::Message(&local_ae8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_ad8,
               (AssertionResult *)"vec3 == check3","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_af0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x74,pcVar3);
    testing::internal::AssertHelper::operator=(&local_af0,&local_ae8);
    testing::internal::AssertHelper::~AssertHelper(&local_af0);
    std::__cxx11::string::~string
              ((string *)
               &vec4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_ae8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad8);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &check4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_108);
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)
             &vec2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,NoTrans,4,
             (vector<float,_std::allocator<float>_> *)
             &check4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_b98[0xc] = 5.0;
  local_b98[0xd] = 6.0;
  local_b98[0xe] = 5.0;
  local_b98[0xf] = 1.0;
  local_b98[8] = 7.0;
  local_b98[9] = 2.0;
  local_b98[10] = 8.0;
  local_b98[0xb] = 9.0;
  local_b98[4] = 2.0;
  local_b98[5] = 7.0;
  local_b98[6] = 8.0;
  local_b98[7] = 3.0;
  local_b98[0] = 3.0;
  local_b98[1] = 5.0;
  local_b98[2] = 4.0;
  local_b98[3] = 1.0;
  local_b50 = local_b98;
  local_b48 = 0x10;
  paVar1 = (allocator<float> *)
           ((long)&gtest_ar__12.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<float>::allocator(paVar1);
  __l_02._M_len = local_b48;
  __l_02._M_array = local_b50;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_b40,__l_02,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&gtest_ar__12.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_bb1 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_b40);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bb0,&local_bb1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb0);
  if (!bVar2) {
    testing::Message::Message(&local_bc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_be8,(internal *)local_bb0,(AssertionResult *)"vec4 == check4","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=(&local_bc8,&local_bc0);
    testing::internal::AssertHelper::~AssertHelper(&local_bc8);
    std::__cxx11::string::~string((string *)&local_be8);
    testing::Message::~Message(&local_bc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bb0);
  local_a90[0] = 0;
  local_a90[1] = 1;
  qclab::qgates::SWAP<float>::setQubits
            ((SWAP<float> *)
             &vec2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,local_a90);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &check4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_108);
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)
             &vec2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,NoTrans,4,
             (vector<float,_std::allocator<float>_> *)
             &check4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__13.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x40a0000040400000;
  __l_01._M_len = 0x10;
  __l_01._M_array = (iterator)&gtest_ar__13.message_;
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)local_b40,__l_01);
  local_c49 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_b40);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c48,&local_c49,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c48);
  if (!bVar2) {
    testing::Message::Message(&local_c58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c80,(internal *)local_c48,(AssertionResult *)"vec4 == check4","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c60,&local_c58);
    testing::internal::AssertHelper::~AssertHelper(&local_c60);
    std::__cxx11::string::~string((string *)&local_c80);
    testing::Message::~Message(&local_c58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c48);
  local_a90[0] = 2;
  local_a90[1] = 3;
  qclab::qgates::SWAP<float>::setQubits
            ((SWAP<float> *)
             &vec2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,local_a90);
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &check4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_108);
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)
             &vec2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,NoTrans,4,
             (vector<float,_std::allocator<float>_> *)
             &check4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__14.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x4000000040400000;
  __l_00._M_len = 0x10;
  __l_00._M_array = (iterator)&gtest_ar__14.message_;
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)local_b40,__l_00);
  local_ce9 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_b40);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ce8,&local_ce9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ce8);
  if (!bVar2) {
    testing::Message::Message(&local_cf8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&swap_4.qubits_,(internal *)local_ce8,(AssertionResult *)"vec4 == check4",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x9c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d00,&local_cf8);
    testing::internal::AssertHelper::~AssertHelper(&local_d00);
    std::__cxx11::string::~string((string *)&swap_4.qubits_);
    testing::Message::~Message(&local_cf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ce8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_b40);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &check4.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_a00);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &check3.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_960);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &check2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::SWAP<float>::~SWAP
            ((SWAP<float> *)
             &vec2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  qclab::qgates::SWAP<float>::SWAP
            ((SWAP<float> *)
             &vec3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,2);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &check3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)local_b0);
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)
             &vec3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<float,_std::allocator<float>_> *)
             &check3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  local_d98[4] = 5.0;
  local_d98[5] = 1.0;
  local_d98[6] = 7.0;
  local_d98[7] = 3.0;
  local_d98[0] = 3.0;
  local_d98[1] = 4.0;
  local_d98[2] = 2.0;
  local_d98[3] = 8.0;
  local_d70 = local_d98;
  local_d68 = 8;
  paVar1 = (allocator<float> *)
           ((long)&gtest_ar__15.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<float>::allocator(paVar1);
  __l._M_len = local_d68;
  __l._M_array = local_d70;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_d60,__l,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&gtest_ar__15.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_db1 = std::operator==((vector<float,_std::allocator<float>_> *)
                              &check3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (vector<float,_std::allocator<float>_> *)local_d60);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_db0,&local_db1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_db0);
  if (!bVar2) {
    testing::Message::Message(&local_dc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&swap_5.qubits_,(internal *)local_db0,(AssertionResult *)"vec3 == check3",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_dc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xac,pcVar3);
    testing::internal::AssertHelper::operator=(&local_dc8,&local_dc0);
    testing::internal::AssertHelper::~AssertHelper(&local_dc8);
    std::__cxx11::string::~string((string *)&swap_5.qubits_);
    testing::Message::~Message(&local_dc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_db0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_d60);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &check3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::SWAP<float>::~SWAP
            ((SWAP<float> *)
             &vec3_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::SWAP<float>::SWAP((SWAP<float> *)&mat2.data_,0,1);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__16.message_,(SquareMatrix<float> *)local_28);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)&mat2.data_,Left,NoTrans,2,(SquareMatrix<float> *)&gtest_ar__16.message_
             ,0);
  qclab::qgates::SWAP<float>::matrix((SWAP<float> *)&local_e30);
  local_e19 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__16.message_,&local_e30);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e18,&local_e19,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_e30);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e18);
  if (!bVar2) {
    testing::Message::Message(&local_e38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat.data_,(internal *)local_e18,(AssertionResult *)"mat2 == swap.matrix()"
               ,"false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xbb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e40,&local_e38);
    testing::internal::AssertHelper::~AssertHelper(&local_e40);
    std::__cxx11::string::~string((string *)&mat.data_);
    testing::Message::~Message(&local_e38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e18);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__17.message_,1.0,2.0,3.0,4.0,5.0,6.0,7.0,8.0,9.0,10.0,
             11.0,12.0,13.0,14.0,15.0,16.0);
  qclab::dense::SquareMatrix<float>::operator=
            ((SquareMatrix<float> *)&gtest_ar__16.message_,
             (SquareMatrix<float> *)&gtest_ar__17.message_);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)&mat2.data_,Left,NoTrans,2,(SquareMatrix<float> *)&gtest_ar__16.message_
             ,0);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            (&local_ea8,(SquareMatrix<float> *)&gtest_ar__17.message_);
  qclab::qgates::SWAP<float>::matrix((SWAP<float> *)&local_eb8);
  qclab::dense::operator*((dense *)&local_e98,&local_ea8,&local_eb8);
  local_e81 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__16.message_,&local_e98);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e80,&local_e81,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_e98);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_eb8);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_ea8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e80);
  if (!bVar2) {
    testing::Message::Message(&local_ec0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_e80,
               (AssertionResult *)"mat2 == mat * swap.matrix()","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ec8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xc4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_ec8,&local_ec0);
    testing::internal::AssertHelper::~AssertHelper(&local_ec8);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_ec0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e80);
  qclab::dense::SquareMatrix<float>::operator=
            ((SquareMatrix<float> *)&gtest_ar__16.message_,
             (SquareMatrix<float> *)&gtest_ar__17.message_);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)&mat2.data_,Right,NoTrans,2,
             (SquareMatrix<float> *)&gtest_ar__16.message_,0);
  qclab::qgates::SWAP<float>::matrix((SWAP<float> *)&local_f20);
  qclab::dense::operator*
            ((dense *)&local_f10,&local_f20,(SquareMatrix<float> *)&gtest_ar__17.message_);
  local_ef9 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__16.message_,&local_f10);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ef8,&local_ef9,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_f10);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_f20);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ef8);
  if (!bVar2) {
    testing::Message::Message(&local_f28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3.data_,(internal *)local_ef8,
               (AssertionResult *)"mat2 == swap.matrix() * mat","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,200,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f30,&local_f28);
    testing::internal::AssertHelper::~AssertHelper(&local_f30);
    std::__cxx11::string::~string((string *)&mat3.data_);
    testing::Message::~Message(&local_f28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ef8);
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__19.message_,(SquareMatrix<float> *)&I4.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)&mat2.data_,Left,NoTrans,3,(SquareMatrix<float> *)&gtest_ar__19.message_
             ,0);
  qclab::qgates::SWAP<float>::matrix((SWAP<float> *)&local_f98);
  qclab::dense::kron<float>((dense *)&local_f88,&local_f98,(SquareMatrix<float> *)&I2.data_);
  local_f71 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__19.message_,&local_f88);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f70,&local_f71,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_f88);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_f98);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f70);
  if (!bVar2) {
    testing::Message::Message(&local_fa0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)qnew_2,(internal *)local_f70,
               (AssertionResult *)"mat3 == qclab::dense::kron( swap.matrix() , I1 )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xcd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_fa8,&local_fa0);
    testing::internal::AssertHelper::~AssertHelper(&local_fa8);
    std::__cxx11::string::~string((string *)qnew_2);
    testing::Message::~Message(&local_fa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f70);
  gtest_ar__20.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x200000001;
  qclab::qgates::SWAP<float>::setQubits((SWAP<float> *)&mat2.data_,(int *)&gtest_ar__20.message_);
  qclab::dense::SquareMatrix<float>::operator=
            ((SquareMatrix<float> *)&gtest_ar__19.message_,(SquareMatrix<float> *)&I4.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)&mat2.data_,Left,NoTrans,3,(SquareMatrix<float> *)&gtest_ar__19.message_
             ,0);
  qclab::qgates::SWAP<float>::matrix((SWAP<float> *)&local_1008);
  qclab::dense::kron<float>((dense *)&local_ff8,(SquareMatrix<float> *)&I2.data_,&local_1008);
  local_fe1 = qclab::dense::SquareMatrix<float>::operator==
                        ((SquareMatrix<float> *)&gtest_ar__19.message_,&local_ff8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fe0,&local_fe1,(type *)0x0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_ff8);
  qclab::dense::SquareMatrix<float>::~SquareMatrix(&local_1008);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fe0);
  if (!bVar2) {
    testing::Message::Message(&local_1010);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&swap_6.qubits_,(internal *)local_fe0,
               (AssertionResult *)"mat3 == qclab::dense::kron( I1 , swap.matrix() )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1018,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xd3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1018,&local_1010);
    testing::internal::AssertHelper::~AssertHelper(&local_1018);
    std::__cxx11::string::~string((string *)&swap_6.qubits_);
    testing::Message::~Message(&local_1010);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fe0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__19.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__17.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__16.message_);
  qclab::qgates::SWAP<float>::~SWAP((SWAP<float> *)&mat2.data_);
  qclab::qgates::SWAP<float>::SWAP((SWAP<float> *)&check.data_,0,2);
  qclab::dense::zeros<float>((dense *)&mat3_1.data_,8);
  pfVar5 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)&mat3_1.data_,0,0);
  *pfVar5 = 1.0;
  pfVar5 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)&mat3_1.data_,4,1);
  *pfVar5 = 1.0;
  pfVar5 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)&mat3_1.data_,2,2);
  *pfVar5 = 1.0;
  pfVar5 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)&mat3_1.data_,6,3);
  *pfVar5 = 1.0;
  pfVar5 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)&mat3_1.data_,1,4);
  *pfVar5 = 1.0;
  pfVar5 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)&mat3_1.data_,5,5);
  *pfVar5 = 1.0;
  pfVar5 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)&mat3_1.data_,3,6);
  *pfVar5 = 1.0;
  pfVar5 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)&mat3_1.data_,7,7);
  *pfVar5 = 1.0;
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)&gtest_ar__21.message_,(SquareMatrix<float> *)&I4.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<float>::apply
            ((SWAP<float> *)&check.data_,Left,NoTrans,3,
             (SquareMatrix<float> *)&gtest_ar__21.message_,0);
  local_1079 = qclab::dense::SquareMatrix<float>::operator==
                         ((SquareMatrix<float> *)&gtest_ar__21.message_,
                          (SquareMatrix<float> *)&mat3_1.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1078,&local_1079,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1078);
  if (!bVar2) {
    testing::Message::Message(&local_1088);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_10b0,(internal *)local_1078,(AssertionResult *)"mat3 == check","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1090,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xe6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1090,&local_1088);
    testing::internal::AssertHelper::~AssertHelper(&local_1090);
    std::__cxx11::string::~string((string *)&local_10b0);
    testing::Message::~Message(&local_1088);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1078);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&gtest_ar__21.message_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&mat3_1.data_);
  qclab::qgates::SWAP<float>::~SWAP((SWAP<float> *)&check.data_);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_108);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_b0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_70);
  qclab::dense::SquareMatrix<float>::~SquareMatrix
            ((SquareMatrix<float> *)
             &v2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&I4.data_);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_28);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)&I2.data_);
  return;
}

Assistant:

void test_qclab_qgates_SWAP() {

  const auto I1 = qclab::dense::eye< T >(  2 ) ;
  const auto I2 = qclab::dense::eye< T >(  4 ) ;
  const auto I3 = qclab::dense::eye< T >(  8 ) ;
  const auto I4 = qclab::dense::eye< T >( 16 ) ;

  using V = std::vector< T > ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;
  const V v4 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 , 7 , 2 , 5 , 6 , 8 , 9 , 5 , 1};

  {
    qclab::qgates::SWAP< T >  swap ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled

    // qubit
    EXPECT_EQ( swap.qubit() , 0 ) ;

    // qubits
    auto qubits = swap.qubits() ;
    EXPECT_EQ( qubits.size() , 2 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;
    EXPECT_EQ( qubits[1] , 1 ) ;
    int qnew[] = { 3 , 5 } ;
    swap.setQubits( &qnew[0] ) ;
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;
    qnew[0] = 0 ;
    qnew[1] = 1 ;
    swap.setQubits( &qnew[0] ) ;

    // matrix
    qclab::dense::SquareMatrix< T >  SWAP_check( 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( swap.matrix() == SWAP_check ) ;

    // print
    swap.print() ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( swap.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "swap q[0], q[1];\n" ) ;
    std::cout << qasm.str() ;

    // operators == and !=
    qclab::qgates::SWAP< T >  swap2( 2 , 4 ) ;
    EXPECT_TRUE(  swap == swap2 ) ;
    EXPECT_FALSE( swap != swap2 ) ;
  }

  {
    qclab::qgates::SWAP< T >  swap( 3 , 5 ) ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    int qubits[] = { 3 , 5 } ;
    qclab::qgates::SWAP< T >  swap( &qubits[0] ) ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 1 ) ;

    // apply (2 qubits)
    auto vec2 = v2 ;
    swap.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 3 , 2 , 5 , 7 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { swap.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // apply (3 qubits)
    auto vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 5 , 4 , 1 , 2 , 7 , 8 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    int qnew[] = { 1 , 2 } ;
    swap.setQubits( &qnew[0] ) ;
    vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 3 , 2 , 5 , 7 , 4 , 8 , 1 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    // apply (4 qubits)
    auto vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    V check4 = { 3 , 5 , 4 , 1 , 2 , 7 , 8 , 3 , 7 , 2 , 8 , 9 , 5 , 6 , 5 , 1};
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ; T* vec4_ = vec4.data() ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif

    qnew[0] = 0 ;
    qnew[1] = 1 ;
    swap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , 2 , 7 , 7 , 2 , 5 , 6 , 4 , 1 , 8 , 3 , 8 , 9 , 5 , 1 } ;
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif

    qnew[0] = 2 ;
    qnew[1] = 3 ;
    swap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 2 , 5 , 7 , 4 , 8 , 1 , 3 , 7 , 5 , 2 , 6 , 8 , 5 , 9 , 1 } ;
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 2 ) ;

    // apply (3 qubits)
    auto vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 4 , 2 , 8 , 5 , 1 , 7 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 1 ) ;

    // apply (2 qubits)
    auto mat2 = I2 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == swap.matrix() ) ;

    qclab::dense::SquareMatrix< T >  mat(  1 ,  2 ,  3 ,  4 ,
                                           5 ,  6 ,  7 ,  8 ,
                                           9 , 10 , 11 , 12 ,
                                          13 , 14 , 15 , 16 ) ;

    mat2 = mat ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == mat * swap.matrix() ) ;

    mat2 = mat ;
    swap.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == swap.matrix() * mat ) ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( swap.matrix() , I1 ) ) ;

    int qnew[] = { 1 , 2 } ;
    swap.setQubits( &qnew[0] ) ;
    mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 , swap.matrix() ) ) ;
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 2 ) ;

    auto check = qclab::dense::zeros< T >( 8 ) ;
    check(0,0) = 1 ;
    check(4,1) = 1 ;
    check(2,2) = 1 ;
    check(6,3) = 1 ;
    check(1,4) = 1 ;
    check(5,5) = 1 ;
    check(3,6) = 1 ;
    check(7,7) = 1 ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == check ) ;
  }

}